

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_enc.cc
# Opt level: O2

bool bssl::ssl_ech_accept_confirmation
               (SSL_HANDSHAKE *hs,Span<unsigned_char> out,Span<const_unsigned_char> client_random,
               SSLTranscript *transcript,bool is_hrr,Span<const_unsigned_char> msg,size_t offset)

{
  string_view label;
  bool bVar1;
  int iVar2;
  EVP_MD *pEVar3;
  size_t sVar4;
  Span<unsigned_char> out_00;
  Span<const_unsigned_char> SVar5;
  Span<const_unsigned_char> SVar6;
  Span<const_unsigned_char> SVar7;
  uint context_len;
  ScopedEVP_MD_CTX ctx;
  size_t secret_len;
  uchar *local_d8;
  size_t sStack_d0;
  size_t local_c8;
  char *pcStack_c0;
  uint8_t secret [64];
  uint8_t context [64];
  
  if (msg.size_ < offset + 8) {
    ERR_put_error(0x10,0,0x44,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_enc.cc"
                  ,0x290);
    return false;
  }
  SVar5 = Span<const_unsigned_char>::subspan(&msg,0,4);
  iVar2 = SSL_is_dtls(hs->ssl);
  sVar4 = (ulong)(iVar2 != 0) * 8 + 4;
  SVar6 = Span<const_unsigned_char>::subspan(&msg,sVar4,offset - sVar4);
  SVar7 = Span<const_unsigned_char>::subspan(&msg,offset + 8,0xffffffffffffffff);
  EVP_MD_CTX_init((EVP_MD_CTX *)&ctx);
  pEVar3 = SSLTranscript::Digest(transcript);
  bVar1 = SSLTranscript::CopyToHashContext(transcript,&ctx.ctx_,pEVar3);
  if ((((bVar1) &&
       (iVar2 = EVP_DigestUpdate((EVP_MD_CTX *)&ctx,SVar5.data_,SVar5.size_), iVar2 != 0)) &&
      (iVar2 = EVP_DigestUpdate((EVP_MD_CTX *)&ctx,SVar6.data_,SVar6.size_), iVar2 != 0)) &&
     ((iVar2 = EVP_DigestUpdate((EVP_MD_CTX *)&ctx,"",8), iVar2 != 0 &&
      (iVar2 = EVP_DigestUpdate((EVP_MD_CTX *)&ctx,SVar7.data_,SVar7.size_), iVar2 != 0)))) {
    iVar2 = EVP_DigestFinal_ex((EVP_MD_CTX *)&ctx,context,&context_len);
    if (iVar2 != 0) {
      pEVar3 = SSLTranscript::Digest(transcript);
      sVar4 = SSLTranscript::DigestLen(transcript);
      iVar2 = HKDF_extract(secret,&secret_len,pEVar3,client_random.data_,client_random.size_,"",
                           sVar4);
      if (iVar2 != 0) {
        if (out.size_ != 8) {
          __assert_fail("out.size() == ECH_CONFIRMATION_SIGNAL_LEN",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_enc.cc"
                        ,0x2b0,
                        "bool bssl::ssl_ech_accept_confirmation(const SSL_HANDSHAKE *, Span<uint8_t>, Span<const uint8_t>, const SSLTranscript &, bool, Span<const uint8_t>, size_t)"
                       );
        }
        pEVar3 = SSLTranscript::Digest(transcript);
        pcStack_c0 = "ech accept confirmation";
        if (is_hrr) {
          pcStack_c0 = "hrr ech accept confirmation";
        }
        local_c8 = (ulong)is_hrr * 4 + 0x17;
        sStack_d0 = (size_t)context_len;
        local_d8 = context;
        iVar2 = SSL_is_dtls(hs->ssl);
        label._M_str = pcStack_c0;
        label._M_len = local_c8;
        SVar5.size_ = sStack_d0;
        SVar5.data_ = local_d8;
        SVar6.size_ = secret_len;
        SVar6.data_ = secret;
        out_00.size_ = 8;
        out_00.data_ = out.data_;
        bVar1 = hkdf_expand_label(out_00,pEVar3,SVar6,label,SVar5,iVar2 != 0);
        goto LAB_00160bbb;
      }
    }
  }
  bVar1 = false;
LAB_00160bbb:
  internal::
  StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
  ::~StackAllocatedMovable(&ctx);
  return bVar1;
}

Assistant:

bool ssl_ech_accept_confirmation(const SSL_HANDSHAKE *hs, Span<uint8_t> out,
                                 Span<const uint8_t> client_random,
                                 const SSLTranscript &transcript, bool is_hrr,
                                 Span<const uint8_t> msg, size_t offset) {
  // See draft-ietf-tls-esni-13, sections 7.2 and 7.2.1.
  static const uint8_t kZeros[EVP_MAX_MD_SIZE] = {0};

  // We hash |msg|, with bytes from |offset| zeroed.
  if (msg.size() < offset + ECH_CONFIRMATION_SIGNAL_LEN) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }

  // We represent DTLS messages with the longer DTLS 1.2 header, but DTLS 1.3
  // removes the extra fields from the transcript.
  auto header = msg.subspan(0, SSL3_HM_HEADER_LENGTH);
  size_t full_header_len =
      SSL_is_dtls(hs->ssl) ? DTLS1_HM_HEADER_LENGTH : SSL3_HM_HEADER_LENGTH;
  auto before_zeros = msg.subspan(full_header_len, offset - full_header_len);
  auto after_zeros = msg.subspan(offset + ECH_CONFIRMATION_SIGNAL_LEN);

  uint8_t context[EVP_MAX_MD_SIZE];
  unsigned context_len;
  ScopedEVP_MD_CTX ctx;
  if (!transcript.CopyToHashContext(ctx.get(), transcript.Digest()) ||
      !EVP_DigestUpdate(ctx.get(), header.data(), header.size()) ||
      !EVP_DigestUpdate(ctx.get(), before_zeros.data(), before_zeros.size()) ||
      !EVP_DigestUpdate(ctx.get(), kZeros, ECH_CONFIRMATION_SIGNAL_LEN) ||
      !EVP_DigestUpdate(ctx.get(), after_zeros.data(), after_zeros.size()) ||
      !EVP_DigestFinal_ex(ctx.get(), context, &context_len)) {
    return false;
  }

  uint8_t secret[EVP_MAX_MD_SIZE];
  size_t secret_len;
  if (!HKDF_extract(secret, &secret_len, transcript.Digest(),
                    client_random.data(), client_random.size(), kZeros,
                    transcript.DigestLen())) {
    return false;
  }

  assert(out.size() == ECH_CONFIRMATION_SIGNAL_LEN);
  return hkdf_expand_label(
      out, transcript.Digest(), Span(secret, secret_len),
      is_hrr ? "hrr ech accept confirmation" : "ech accept confirmation",
      Span(context, context_len), SSL_is_dtls(hs->ssl));
}